

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_pax_sparse.c
# Opt level: O0

void test_compat_solaris_pax_sparse_2(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  time_t v2;
  la_int64_t lVar5;
  void *_v1;
  bool local_a2;
  bool local_a1;
  char *last;
  char data [32];
  ulong uStack_68;
  int r;
  size_t bytes_read;
  void *buff;
  int64_t length;
  int64_t offset;
  archive *a;
  archive_entry *ae;
  char name [39];
  
  memcpy(&ae,"test_compat_solaris_pax_sparse_2.pax.Z",0x27);
  offset = (int64_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                   ,L'z',(uint)((archive *)offset != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)offset);
  iVar1 = archive_read_support_format_all((archive *)offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      (void *)offset);
  extract_reference_file((char *)&ae);
  wVar2 = archive_read_open_filename((archive_conflict *)offset,(char *)&ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'~',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      (void *)offset);
  iVar1 = archive_read_next_header((archive *)offset,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",
                      (void *)offset);
  if (iVar1 == 0) {
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x86',"hole","\"hole\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v2 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x87',0x4e1b5f95,"1310416789",v2,"archive_entry_mtime(ae)",(void *)0x0);
    lVar5 = archive_entry_uid((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x88',0x65,"101",lVar5,"archive_entry_uid(ae)",(void *)0x0);
    pcVar4 = archive_entry_uname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x89',"cue","\"cue\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_gid((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8a',10,"10",lVar5,"archive_entry_gid(ae)",(void *)0x0);
    pcVar4 = archive_entry_gname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x8b',"staff","\"staff\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8c',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0)
    ;
    failure("This sparse file should have two data blocks");
    wVar2 = archive_entry_sparse_reset((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x90',2,"2",(long)wVar2,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar2 = archive_entry_sparse_next((archive_entry *)a,&length,(la_int64_t *)&buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x92',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x93',0x60000,"393216",length,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x94',0x20000,"131072",(longlong)buff,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next((archive_entry *)a,&length,(la_int64_t *)&buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x97',0xc0000,"786432",length,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x98',0x801f,"32799",(longlong)buff,"length",(void *)0x0);
    while (iVar1 = archive_read_data_block
                             ((archive *)offset,(void **)&bytes_read,&stack0xffffffffffffff98,
                              &length), iVar1 == 0) {
      failure("The data blocks should not include the hole");
      if ((length < 0x60000) || (local_a1 = true, 0x80000 < length + uStack_68)) {
        local_a2 = 0xbffff < length && length + uStack_68 < 0xc8020;
        local_a1 = local_a2;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                       ,L'\x9d',(uint)local_a1,
                       "(offset >= 393216 && offset + bytes_read <= 393216+131072) || (offset >= 786432 && offset + bytes_read <= 786432+32799)"
                       ,(void *)0x0);
      if ((length + uStack_68 == 0xc801f) && (0x1e < uStack_68)) {
        _v1 = (void *)((uStack_68 - 0x1f) + bytes_read);
        memset(&last,99,0x1f);
        failure("Last 31 bytes should be all \'c\'");
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                            ,L'¤',_v1,"last",&last,"data",0x1f,"31",(void *)0x0);
      }
    }
    iVar1 = archive_read_next_header((archive *)offset,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'©',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                        (void *)offset);
    iVar1 = archive_filter_code((archive *)offset,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¬',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                        (void *)0x0);
    iVar1 = archive_format((archive *)offset);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'­',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    iVar1 = archive_read_close((archive *)offset);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)offset);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'°',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)offset);
  }
  return;
}

Assistant:

static void
test_compat_solaris_pax_sparse_2(void)
{
	char name[] = "test_compat_solaris_pax_sparse_2.pax.Z";
	struct archive_entry *ae;
	struct archive *a;
	int64_t offset, length;
	const void *buff;
	size_t bytes_read;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString("hole", archive_entry_pathname(ae));
	assertEqualInt(1310416789, archive_entry_mtime(ae));
	assertEqualInt(101, archive_entry_uid(ae));
	assertEqualString("cue", archive_entry_uname(ae));
	assertEqualInt(10, archive_entry_gid(ae));
	assertEqualString("staff", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Verify the sparse information. */
	failure("This sparse file should have two data blocks");
	assertEqualInt(2, archive_entry_sparse_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(393216, offset);
	assertEqualInt(131072, length);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(786432, offset);
	assertEqualInt(32799, length);
	while (ARCHIVE_OK ==
	    archive_read_data_block(a, &buff, &bytes_read, &offset)) {
		failure("The data blocks should not include the hole");
		assert((offset >= 393216 && offset + bytes_read <= 393216+131072) ||
		       (offset >= 786432 && offset + bytes_read <= 786432+32799));
		if (offset + bytes_read == 819231 && bytes_read >= 31) {
			char data[32];
			const char *last = buff;
			last += bytes_read - 31;
			memset(data, 'c', 31);
			failure("Last 31 bytes should be all 'c'");
			assertEqualMem(last, data, 31);
		}
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}